

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

SRes SzDecodeLzma2(Byte *props,uint propsSize,UInt64 inSize,ILookInStream *inStream,Byte *outBuffer,
                  SizeT outSize,ISzAlloc *allocMain)

{
  undefined8 *in_RCX;
  ulong in_RDX;
  int in_ESI;
  undefined8 in_R8;
  CLzma2Dec *in_R9;
  ELzmaStatus status;
  SizeT dicPos;
  SizeT inProcessed;
  size_t lookahead;
  void *inBuf;
  int __result__;
  SRes res;
  CLzma2Dec state;
  ISzAlloc *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  ISzAlloc *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  ulong uVar1;
  CLzma2Dec *in_stack_ffffffffffffff08;
  undefined8 local_f0;
  SRes local_e8;
  SRes local_e4;
  ELzmaStatus *status_00;
  SizeT *in_stack_ffffffffffffff40;
  Byte *in_stack_ffffffffffffff48;
  CLzma2Dec *in_stack_ffffffffffffff50;
  CLzma2Dec *pCVar2;
  CLzma2Dec *p;
  ulong local_20;
  SRes local_4;
  
  local_e4 = 0;
  status_00 = (ELzmaStatus *)0x0;
  if (in_ESI == 1) {
    local_e8 = Lzma2Dec_AllocateProbs
                         (in_stack_ffffffffffffff08,(Byte)((ulong)in_stack_ffffffffffffff00 >> 0x38)
                          ,in_stack_fffffffffffffef8);
    local_4 = local_e8;
    if (local_e8 == 0) {
      p = in_R9;
      Lzma2Dec_Init((CLzma2Dec *)0x9ef330);
      local_20 = in_RDX;
      while( true ) {
        local_f0 = 0;
        uVar1 = 0x40000;
        if (local_20 < 0x40000) {
          uVar1 = local_20;
        }
        local_e4 = (*(code *)*in_RCX)(in_RCX,&local_f0,&stack0xffffffffffffff08);
        if (local_e4 != 0) goto LAB_009ef475;
        pCVar2 = in_stack_ffffffffffffff50;
        local_e4 = Lzma2Dec_DecodeToDic
                             (p,(SizeT)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                              in_stack_ffffffffffffff40,(ELzmaFinishMode)((ulong)in_R8 >> 0x20),
                              status_00);
        local_20 = local_20 - uVar1;
        if (local_e4 != 0) goto LAB_009ef475;
        if (in_stack_fffffffffffffef4 == 1) break;
        if ((uVar1 == 0) && (in_stack_ffffffffffffff50 == pCVar2)) {
          local_e4 = 1;
          goto LAB_009ef475;
        }
        local_e4 = (*(code *)in_RCX[1])(in_RCX,uVar1);
        if (local_e4 != 0) goto LAB_009ef475;
        local_e4 = 0;
        in_stack_ffffffffffffff50 = pCVar2;
      }
      if ((in_R9 != pCVar2) || (local_20 != 0)) {
        local_e4 = 1;
      }
LAB_009ef475:
      LzmaDec_FreeProbs((CLzmaDec *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffee8);
      local_4 = local_e4;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static SRes SzDecodeLzma2(const Byte *props, unsigned propsSize, UInt64 inSize, ILookInStream *inStream,
    Byte *outBuffer, SizeT outSize, ISzAlloc *allocMain)
{
  CLzma2Dec state;
  SRes res = SZ_OK;

  Lzma2Dec_Construct(&state);
  if (propsSize != 1)
    return SZ_ERROR_DATA;
  RINOK(Lzma2Dec_AllocateProbs(&state, props[0], allocMain));
  state.decoder.dic = outBuffer;
  state.decoder.dicBufSize = outSize;
  Lzma2Dec_Init(&state);

  for (;;)
  {
    const void *inBuf = NULL;
    size_t lookahead = (1 << 18);
    if (lookahead > inSize)
      lookahead = (size_t)inSize;
    res = inStream->Look(inStream, &inBuf, &lookahead);
    if (res != SZ_OK)
      break;

    {
      SizeT inProcessed = (SizeT)lookahead, dicPos = state.decoder.dicPos;
      ELzmaStatus status;
      res = Lzma2Dec_DecodeToDic(&state, outSize, inBuf, &inProcessed, LZMA_FINISH_END, &status);
      lookahead -= inProcessed;
      inSize -= inProcessed;
      if (res != SZ_OK)
        break;

      if (status == LZMA_STATUS_FINISHED_WITH_MARK)
      {
        if (outSize != state.decoder.dicPos || inSize != 0)
          res = SZ_ERROR_DATA;
        break;
      }

      if (inProcessed == 0 && dicPos == state.decoder.dicPos)
      {
        res = SZ_ERROR_DATA;
        break;
      }

      res = inStream->Skip((void *)inStream, inProcessed);
      if (res != SZ_OK)
        break;
    }
  }

  Lzma2Dec_FreeProbs(&state, allocMain);
  return res;
}